

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QStringList * __thiscall QFileDialog::history(QStringList *__return_storage_ptr__,QFileDialog *this)

{
  QFileDialogPrivate *this_00;
  Ui_QFileDialog *pUVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QModelIndex QStack_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  pUVar1 = (this_00->qFileDialogUi).d;
  if ((pUVar1 == (Ui_QFileDialog *)0x0 | (this_00->super_QDialogPrivate).nativeDialogInUse) == 1) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0049715d:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QString>::QArrayDataPointer
              (&__return_storage_ptr__->d,&(pUVar1->lookInCombo->m_history).d);
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileDialogPrivate::rootIndex(&QStack_98,this_00);
    QModelIndex::data(&local_48,&QStack_98,0x101);
    ::QVariant::toString();
    QDir::toNativeSeparators((QString *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    ::QVariant::~QVariant(&local_48);
    bVar2 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)__return_storage_ptr__,(QString *)&local_68,
                       CaseSensitive);
    if (!bVar2) {
      QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_68);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0049715d;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QFileDialog::history() const
{
    Q_D(const QFileDialog);
    if (!d->usingWidgets())
        return QStringList();
    QStringList currentHistory = d->qFileDialogUi->lookInCombo->history();
    //On windows the popup display the "C:\", convert to nativeSeparators
    QString newHistory = QDir::toNativeSeparators(d->rootIndex().data(QFileSystemModel::FilePathRole).toString());
    if (!currentHistory.contains(newHistory))
        currentHistory << newHistory;
    return currentHistory;
}